

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O2

void Minisat::selectionSort<Minisat::Lit,Minisat::LessThan_default<Minisat::Lit>>
               (long array,uint size)

{
  undefined4 uVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar3 = 1;
  if (1 < (int)size) {
    uVar3 = size;
  }
  uVar4 = 1;
  for (uVar5 = 0; uVar5 != uVar3 - 1; uVar5 = uVar5 + 1) {
    uVar7 = uVar5 & 0xffffffff;
    for (uVar6 = uVar4; lVar8 = (long)(int)uVar7, size != uVar6; uVar6 = uVar6 + 1) {
      uVar2 = uVar6 & 0xffffffff;
      if (*(int *)(array + lVar8 * 4) <= *(int *)(array + uVar6 * 4)) {
        uVar2 = uVar7;
      }
      uVar7 = uVar2;
    }
    uVar1 = *(undefined4 *)(array + uVar5 * 4);
    *(undefined4 *)(array + uVar5 * 4) = *(undefined4 *)(array + lVar8 * 4);
    *(undefined4 *)(array + lVar8 * 4) = uVar1;
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void selectionSort(T *array, int size, LessThan lt)
{
    int i, j, best_i;
    T tmp;

    for (i = 0; i < size - 1; i++) {
        best_i = i;
        for (j = i + 1; j < size; j++) {
            if (lt(array[j], array[best_i])) best_i = j;
        }
        tmp = array[i];
        array[i] = array[best_i];
        array[best_i] = tmp;
    }
}